

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall kj::Array<capnp::Text::Reader>::~Array(Array<capnp::Text::Reader> *this)

{
  Array<capnp::Text::Reader> *this_local;
  
  dispose(this);
  return;
}

Assistant:

inline ~Array() noexcept { dispose(); }